

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format-inl.h
# Opt level: O3

char * __thiscall
fmt::v7::detail::utf8_to_utf16::utf8_to_utf16::anon_class_8_1_8991fb9c::operator()
          (anon_class_8_1_8991fb9c *this,char *p)

{
  uint uVar1;
  utf8_to_utf16 *puVar2;
  runtime_error *this_00;
  utf8_to_utf16 *puVar3;
  utf8_to_utf16 *puVar4;
  utf8_to_utf16 *puVar5;
  wchar_t wVar6;
  long lVar7;
  
  uVar1 = (uint)((byte)*p >> 3);
  lVar7 = (long)(char)(&DAT_00138910)[uVar1] + (ulong)((0x80ff0000U >> uVar1 & 1) != 0);
  wVar6 = ((byte)p[3] & 0x3f |
          ((byte)p[2] & 0x3f) << 6 |
          ((byte)p[1] & 0x3f) << 0xc |
          ((uint)(byte)*p &
          *(uint *)(utf8_decode(char_const*,unsigned_int*,int*)::masks + lVar7 * 4)) << 0x12) >>
          (utf8_decode(char_const*,unsigned_int*,int*)::shiftc[lVar7 * 4] & 0x1f);
  if (((((byte)p[1] >> 2 & 0xfffffff0) + (uint)((byte)p[2] >> 6) * 4 | (uint)((byte)p[3] >> 6) |
        (uint)((uint)wVar6 <
              (uint)*(wchar_t *)(utf8_decode(char_const*,unsigned_int*,int*)::mins + lVar7 * 4)) <<
        6 | (uint)(0x10ffff < (uint)wVar6) << 8 | (uint)((wVar6 & 0x7ffff800U) == 0xd800) << 7) ^
      0x2a) >> (utf8_decode(char_const*,unsigned_int*,int*)::shifte[lVar7 * 4] & 0x1f) == 0) {
    if ((uint)wVar6 < 0x10000) {
      puVar2 = this[2].this;
      puVar5 = (utf8_to_utf16 *)((long)&(puVar2->buffer_).super_buffer<wchar_t>._vptr_buffer + 1);
      if (this[3].this < puVar5) {
        (*(code *)(this->this->buffer_).super_buffer<wchar_t>._vptr_buffer)(this);
        puVar2 = this[2].this;
        puVar5 = (utf8_to_utf16 *)((long)&(puVar2->buffer_).super_buffer<wchar_t>._vptr_buffer + 1);
      }
      this[2].this = puVar5;
      ((this[1].this)->buffer_).store_[(long)&puVar2[-1].buffer_.field_0x7f0] = wVar6;
    }
    else {
      puVar2 = this[2].this;
      puVar3 = this[3].this;
      puVar5 = (utf8_to_utf16 *)((long)&(puVar2->buffer_).super_buffer<wchar_t>._vptr_buffer + 1);
      if (puVar3 < puVar5) {
        (*(code *)(this->this->buffer_).super_buffer<wchar_t>._vptr_buffer)(this);
        puVar2 = this[2].this;
        puVar3 = this[3].this;
        puVar5 = (utf8_to_utf16 *)((long)&(puVar2->buffer_).super_buffer<wchar_t>._vptr_buffer + 1);
      }
      puVar4 = this[1].this;
      this[2].this = puVar5;
      (puVar4->buffer_).store_[(long)&puVar2[-1].buffer_.field_0x7f0] =
           ((uint)(wVar6 + L'\xffff0000') >> 10) + L'\xd800';
      puVar2 = (utf8_to_utf16 *)((long)&(puVar5->buffer_).super_buffer<wchar_t>._vptr_buffer + 1);
      if (puVar3 < puVar2) {
        (*(code *)(this->this->buffer_).super_buffer<wchar_t>._vptr_buffer)(this,puVar2);
        puVar4 = this[1].this;
        puVar5 = this[2].this;
        puVar2 = (utf8_to_utf16 *)((long)&(puVar5->buffer_).super_buffer<wchar_t>._vptr_buffer + 1);
      }
      this[2].this = puVar2;
      (puVar4->buffer_).store_[(long)&puVar5[-1].buffer_.field_0x7f0] = wVar6 & 0x3ffU | 0xdc00;
    }
    return p + lVar7;
  }
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(this_00,"invalid utf8");
  __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

FMT_FUNC detail::utf8_to_utf16::utf8_to_utf16(string_view s) {
  auto transcode = [this](const char* p) {
    auto cp = uint32_t();
    auto error = 0;
    p = utf8_decode(p, &cp, &error);
    if (error != 0) FMT_THROW(std::runtime_error("invalid utf8"));
    if (cp <= 0xFFFF) {
      buffer_.push_back(static_cast<wchar_t>(cp));
    } else {
      cp -= 0x10000;
      buffer_.push_back(static_cast<wchar_t>(0xD800 + (cp >> 10)));
      buffer_.push_back(static_cast<wchar_t>(0xDC00 + (cp & 0x3FF)));
    }
    return p;
  };
  auto p = s.data();
  const size_t block_size = 4;  // utf8_decode always reads blocks of 4 chars.
  if (s.size() >= block_size) {
    for (auto end = p + s.size() - block_size + 1; p < end;) p = transcode(p);
  }
  if (auto num_chars_left = s.data() + s.size() - p) {
    char buf[2 * block_size - 1] = {};
    memcpy(buf, p, to_unsigned(num_chars_left));
    p = buf;
    do {
      p = transcode(p);
    } while (p - buf < num_chars_left);
  }
  buffer_.push_back(0);
}